

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::
     deletePointers<std::map<int,OpenMD::Molecule*,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>>
               (map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
                *container)

{
  bool bVar1;
  iterator this;
  pair<const_int,_OpenMD::Molecule_*> *elem;
  iterator __end0;
  iterator __begin0;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *__range3;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_stack_ffffffffffffffd8;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
       ::begin(in_stack_ffffffffffffffd8);
  this = std::
         map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
         ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::operator!=(local_18,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)0x14dc20);
    details::lifted_deleter<int_const,OpenMD::Molecule*>
              ((pair<const_int,_OpenMD::Molecule_*> *)0x14dc2d);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)this._M_node);
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }